

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.c
# Opt level: O0

_Bool av1_cnn_predict_c(float **input,int in_width,int in_height,int in_stride,
                       CNN_CONFIG *cnn_config,CNN_THREAD_DATA *thread_data,
                       CNN_MULTI_OUT *output_struct)

{
  int iVar1;
  long lVar2;
  _Bool _Var3;
  int channels;
  CNN_LAYER_CONFIG *layer_config_00;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  float **in_RDI;
  int *in_R8;
  int *in_R9;
  int *in_stack_00000008;
  int b_5;
  int b_4;
  int b_3;
  int num_chs;
  int existing_channels;
  int b_2;
  int b_1;
  int output_num;
  CNN_BRANCH_CONFIG *branch_config;
  int branch;
  CNN_LAYER_CONFIG *layer_config;
  int layer;
  int *out_stride;
  int b;
  int o_height;
  int o_width;
  int i_height;
  int i_width;
  int out_idx;
  int *out_chs;
  float **output [4];
  TENSOR tensor2 [4];
  TENSOR tensor1 [4];
  _Bool success;
  float *in_stack_ffffffffffffbe68;
  uint height;
  TENSOR *in_stack_ffffffffffffbe70;
  uint uVar4;
  TENSOR *in_stack_ffffffffffffbe78;
  int in_stack_ffffffffffffbe80;
  int in_stack_ffffffffffffbe84;
  int in_stack_ffffffffffffbe88;
  int in_stack_ffffffffffffbe8c;
  int in_stack_ffffffffffffbe90;
  int in_stack_ffffffffffffbe94;
  int in_stack_ffffffffffffbe98;
  int iVar5;
  int local_4144;
  int iVar6;
  int height_00;
  int width;
  int in_height_00;
  int local_4128;
  int iVar7;
  long lVar8;
  float **input_00;
  long local_4110 [3];
  undefined1 local_40f8 [4];
  int aiStack_40f4 [5];
  int in_stack_ffffffffffffbf20;
  undefined4 in_stack_ffffffffffffbf24;
  int in_stack_ffffffffffffbf28;
  undefined4 in_stack_ffffffffffffbf2c;
  int in_stack_ffffffffffffbf30;
  int in_stack_ffffffffffffbf34;
  int in_stack_ffffffffffffbf38;
  int in_stack_ffffffffffffbf3c;
  float **in_stack_ffffffffffffbf40;
  int in_stack_ffffffffffffbf50;
  CNN_THREAD_DATA *in_stack_ffffffffffffc5d0;
  CNN_LAYER_CONFIG *in_stack_ffffffffffffc5d8;
  int in_stack_ffffffffffffc5e4;
  int in_stack_ffffffffffffc5e8;
  int in_stack_ffffffffffffc5ec;
  float **in_stack_ffffffffffffc5f0;
  float **in_stack_ffffffffffffc600;
  int in_stack_ffffffffffffc608;
  TENSOR *in_stack_ffffffffffffc678;
  TENSOR *in_stack_ffffffffffffc680;
  TENSOR *in_stack_ffffffffffffc690;
  TENSOR *in_stack_ffffffffffffc698;
  TENSOR local_2098 [4];
  byte local_29;
  int *local_28;
  int *local_20;
  int local_14;
  int local_10;
  int local_c;
  float **local_8;
  
  local_29 = 0;
  local_28 = in_R9;
  local_20 = in_R8;
  local_14 = in_ECX;
  local_10 = in_EDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  memset(local_2098,0,0x2060);
  memset(local_40f8,0,0x2060);
  lVar8 = *(long *)(in_stack_00000008 + 2);
  input_00 = *(float ***)(in_stack_00000008 + 6);
  for (iVar7 = 1; iVar7 < *in_stack_00000008; iVar7 = iVar7 + 1) {
    *(long *)(local_40f8 + (long)iVar7 * 8 + -0x20) =
         *(long *)(local_40f8 + (long)(iVar7 + -1) * 8 + -0x20) +
         (long)*(int *)(lVar8 + (long)(iVar7 + -1) * 4) * 8;
  }
  local_4128 = local_c;
  width = 0;
  height_00 = 0;
  in_height_00 = local_10;
  for (iVar6 = 0; iVar6 < 4; iVar6 = iVar6 + 1) {
    init_tensor((TENSOR *)0x7094bf);
    init_tensor((TENSOR *)0x7094db);
  }
  lVar2 = *(long *)(in_stack_00000008 + 4);
  for (local_4144 = 0; height = (uint)((ulong)in_stack_ffffffffffffbe68 >> 0x20),
      local_4144 < *local_20; local_4144 = local_4144 + 1) {
    layer_config_00 = (CNN_LAYER_CONFIG *)(local_20 + (long)local_4144 * 0x1e + 6);
    iVar1 = layer_config_00->branch;
    if (local_4144 == 0) {
      assign_tensor(local_2098 + iVar1,local_8,layer_config_00->in_channels,local_c,local_10,
                    local_14);
    }
    else {
      swap_tensor(in_stack_ffffffffffffc680,in_stack_ffffffffffffc678);
      local_4128 = local_2098[iVar1].width;
      in_height_00 = local_2098[iVar1].height;
    }
    av1_find_cnn_layer_output_size
              (local_4128,in_height_00,layer_config_00,(int *)&stack0xffffffffffffbed0,
               (int *)&stack0xffffffffffffbecc);
    iVar5 = layer_config_00->output_num;
    if (iVar5 == -1) {
      _Var3 = realloc_tensor(in_stack_ffffffffffffbe78,
                             (int)((ulong)in_stack_ffffffffffffbe70 >> 0x20),
                             (int)in_stack_ffffffffffffbe70,height);
      if (!_Var3) goto LAB_00709ebe;
    }
    else {
      free_tensor((TENSOR *)0x709688);
      assign_tensor((TENSOR *)(local_40f8 + (long)iVar1 * 0x818),
                    *(float ***)(local_40f8 + (long)iVar5 * 8 + -0x20),layer_config_00->out_channels
                    ,width,height_00,*(int *)(lVar2 + (long)iVar5 * 4));
    }
    if ((layer_config_00->branch_copy_type == '\x01') &&
       (_Var3 = copy_active_tensor_to_branches
                          ((TENSOR *)CONCAT44(iVar5,in_stack_ffffffffffffbe98),
                           (CNN_LAYER_CONFIG *)
                           CONCAT44(in_stack_ffffffffffffbe94,in_stack_ffffffffffffbe90),
                           in_stack_ffffffffffffbe8c,
                           (TENSOR *)CONCAT44(in_stack_ffffffffffffbe84,in_stack_ffffffffffffbe80)),
       !_Var3)) goto LAB_00709ebe;
    if (local_20[(long)local_4144 * 0x1e + 0x13] == 0) {
      uVar4 = (uint)((ulong)in_stack_ffffffffffffbe70 >> 0x20);
      if (*local_28 < 2) {
        in_stack_ffffffffffffbe68 = (float *)((ulong)height << 0x20);
        in_stack_ffffffffffffbe70 = (TENSOR *)((ulong)uVar4 << 0x20);
        in_stack_ffffffffffffbe78 =
             (TENSOR *)CONCAT44((int)((ulong)in_stack_ffffffffffffbe78 >> 0x20),1);
        av1_cnn_convolve(input_00,(int)((ulong)lVar8 >> 0x20),(int)lVar8,iVar7,
                         (CNN_LAYER_CONFIG *)CONCAT44(in_height_00,width),
                         (float **)CONCAT44(height_00,iVar6),in_stack_ffffffffffffbf20,
                         in_stack_ffffffffffffbf28,in_stack_ffffffffffffbf30);
      }
      else {
        in_stack_ffffffffffffbe68 = (float *)(&stack0xffffffffffffbf20 + (long)iVar1 * 0x818);
        in_stack_ffffffffffffbe70 = (TENSOR *)CONCAT44(uVar4,aiStack_40f4[(long)iVar1 * 0x206 + 3]);
        convolve_layer_mt(in_stack_ffffffffffffc5f0,in_stack_ffffffffffffc5ec,
                          in_stack_ffffffffffffc5e8,in_stack_ffffffffffffc5e4,
                          in_stack_ffffffffffffc5d8,in_stack_ffffffffffffc5d0,
                          in_stack_ffffffffffffc600,in_stack_ffffffffffffc608);
      }
    }
    else {
      in_stack_ffffffffffffbe68 = (float *)((ulong)height << 0x20);
      av1_cnn_deconvolve_c
                (in_stack_ffffffffffffbf40,in_stack_ffffffffffffbf3c,in_stack_ffffffffffffbf38,
                 in_stack_ffffffffffffbf34,
                 (CNN_LAYER_CONFIG *)CONCAT44(in_stack_ffffffffffffbf2c,in_stack_ffffffffffffbf28),
                 (float **)CONCAT44(in_stack_ffffffffffffbf24,in_stack_ffffffffffffbf20),
                 in_stack_ffffffffffffbf50);
    }
    if ((layer_config_00->branch_copy_type == '\x02') &&
       (_Var3 = copy_active_tensor_to_branches
                          ((TENSOR *)CONCAT44(iVar5,in_stack_ffffffffffffbe98),
                           (CNN_LAYER_CONFIG *)
                           CONCAT44(in_stack_ffffffffffffbe94,in_stack_ffffffffffffbe90),
                           in_stack_ffffffffffffbe8c,
                           (TENSOR *)CONCAT44(in_stack_ffffffffffffbe84,in_stack_ffffffffffffbe80)),
       !_Var3)) goto LAB_00709ebe;
    if (layer_config_00->branch_combine_type == '\x01') {
      for (in_stack_ffffffffffffbe98 = 0; in_stack_ffffffffffffbe98 < 4;
          in_stack_ffffffffffffbe98 = in_stack_ffffffffffffbe98 + 1) {
        if ((((layer_config_00->branch_config).branches_to_combine &
             1 << ((byte)in_stack_ffffffffffffbe98 & 0x1f)) != 0) &&
           (in_stack_ffffffffffffbe98 != iVar1)) {
          av1_cnn_add_c((float **)(&stack0xffffffffffffbf20 + (long)iVar1 * 0x818),
                        aiStack_40f4[(long)iVar1 * 0x206],aiStack_40f4[(long)iVar1 * 0x206 + 1],
                        aiStack_40f4[(long)iVar1 * 0x206 + 2],aiStack_40f4[(long)iVar1 * 0x206 + 3],
                        (float **)
                        (&stack0xffffffffffffbf20 + (long)in_stack_ffffffffffffbe98 * 0x818));
        }
      }
    }
    av1_cnn_activate_c((float **)CONCAT44(in_stack_ffffffffffffbe94,in_stack_ffffffffffffbe90),
                       in_stack_ffffffffffffbe8c,in_stack_ffffffffffffbe88,in_stack_ffffffffffffbe84
                       ,in_stack_ffffffffffffbe80,
                       (ACTIVATION)((ulong)in_stack_ffffffffffffbe78 >> 0x38));
    if ((layer_config_00->bn_params).bn_gamma != (float *)0x0) {
      in_stack_ffffffffffffbe68 = (layer_config_00->bn_params).bn_beta;
      in_stack_ffffffffffffbe70 = (TENSOR *)(layer_config_00->bn_params).bn_mean;
      in_stack_ffffffffffffbe78 = (TENSOR *)(layer_config_00->bn_params).bn_std;
      av1_cnn_batchnorm_c((float **)(&stack0xffffffffffffbf20 + (long)iVar1 * 0x818),
                          aiStack_40f4[(long)iVar1 * 0x206],aiStack_40f4[(long)iVar1 * 0x206 + 1],
                          aiStack_40f4[(long)iVar1 * 0x206 + 2],
                          aiStack_40f4[(long)iVar1 * 0x206 + 3],
                          (layer_config_00->bn_params).bn_gamma,in_stack_ffffffffffffbe68,
                          (float *)in_stack_ffffffffffffbe70,(float *)in_stack_ffffffffffffbe78);
    }
    if (layer_config_00->branch_combine_type == '\x02') {
      if (iVar5 == -1) {
        for (in_stack_ffffffffffffbe94 = 0; in_stack_ffffffffffffbe94 < 4;
            in_stack_ffffffffffffbe94 = in_stack_ffffffffffffbe94 + 1) {
          if (((((layer_config_00->branch_config).branches_to_combine &
                1 << ((byte)in_stack_ffffffffffffbe94 & 0x1f)) != 0) &&
              (in_stack_ffffffffffffbe94 != iVar1)) &&
             (_Var3 = concat_tensor(in_stack_ffffffffffffc698,in_stack_ffffffffffffc690), !_Var3))
          goto LAB_00709ebe;
        }
      }
      else {
        in_stack_ffffffffffffbe8c = aiStack_40f4[(long)iVar1 * 0x206];
        channels = in_stack_ffffffffffffbe8c;
        for (in_stack_ffffffffffffbe88 = 0; in_stack_ffffffffffffbe88 < 4;
            in_stack_ffffffffffffbe88 = in_stack_ffffffffffffbe88 + 1) {
          if ((((layer_config_00->branch_config).branches_to_combine &
               1 << ((byte)in_stack_ffffffffffffbe88 & 0x1f)) != 0) &&
             (in_stack_ffffffffffffbe88 != iVar1)) {
            channels = aiStack_40f4[(long)in_stack_ffffffffffffbe88 * 0x206] + channels;
          }
        }
        assign_tensor((TENSOR *)(local_40f8 + (long)iVar1 * 0x818),
                      *(float ***)(local_40f8 + (long)iVar5 * 8 + -0x20),channels,width,height_00,
                      *(int *)(lVar2 + (long)iVar5 * 4));
        in_stack_ffffffffffffbe90 = in_stack_ffffffffffffbe8c;
        for (in_stack_ffffffffffffbe84 = 0; in_stack_ffffffffffffbe84 < 4;
            in_stack_ffffffffffffbe84 = in_stack_ffffffffffffbe84 + 1) {
          if ((((layer_config_00->branch_config).branches_to_combine &
               1 << ((byte)in_stack_ffffffffffffbe84 & 0x1f)) != 0) &&
             (in_stack_ffffffffffffbe84 != iVar1)) {
            copy_tensor((TENSOR *)CONCAT44(in_stack_ffffffffffffbe84,in_stack_ffffffffffffbe80),
                        (int)((ulong)in_stack_ffffffffffffbe78 >> 0x20),
                        (int)in_stack_ffffffffffffbe78,in_stack_ffffffffffffbe70);
            in_stack_ffffffffffffbe8c =
                 aiStack_40f4[(long)in_stack_ffffffffffffbe84 * 0x206] + in_stack_ffffffffffffbe8c;
          }
        }
      }
    }
    if ((layer_config_00->branch_copy_type == '\x03') &&
       (_Var3 = copy_active_tensor_to_branches
                          ((TENSOR *)CONCAT44(iVar5,in_stack_ffffffffffffbe98),
                           (CNN_LAYER_CONFIG *)
                           CONCAT44(in_stack_ffffffffffffbe94,in_stack_ffffffffffffbe90),
                           in_stack_ffffffffffffbe8c,
                           (TENSOR *)CONCAT44(in_stack_ffffffffffffbe84,in_stack_ffffffffffffbe80)),
       !_Var3)) goto LAB_00709ebe;
  }
  local_29 = 1;
LAB_00709ebe:
  for (iVar7 = 0; iVar7 < 4; iVar7 = iVar7 + 1) {
    free_tensor((TENSOR *)0x709ee9);
    free_tensor((TENSOR *)0x709f05);
  }
  return (_Bool)(local_29 & 1);
}

Assistant:

bool av1_cnn_predict_c(const float **input, int in_width, int in_height,
                       int in_stride, const CNN_CONFIG *cnn_config,
                       const CNN_THREAD_DATA *thread_data,
                       CNN_MULTI_OUT *output_struct) {
  bool success = false;
  TENSOR tensor1[CNN_MAX_BRANCHES] = { { 0 } };
  TENSOR tensor2[CNN_MAX_BRANCHES] = { { 0 } };

  float **output[CNN_MAX_BRANCHES];
  const int *out_chs = output_struct->output_channels;
  output[0] = output_struct->output_buffer;
  for (int out_idx = 1; out_idx < output_struct->num_outputs; out_idx++) {
    output[out_idx] = output[out_idx - 1] + out_chs[out_idx - 1];
  }

  int i_width = in_width;
  int i_height = in_height;
  int o_width = 0, o_height = 0;
  for (int b = 0; b < CNN_MAX_BRANCHES; ++b) {
    init_tensor(&tensor1[b]);
    init_tensor(&tensor2[b]);
  }

  const int *out_stride = output_struct->output_strides;
  for (int layer = 0; layer < cnn_config->num_layers; ++layer) {
    const CNN_LAYER_CONFIG *layer_config = &cnn_config->layer_config[layer];
    const int branch = layer_config->branch;
    const CNN_BRANCH_CONFIG *branch_config = &layer_config->branch_config;

    // Allocate input tensor
    if (layer == 0) {       // First layer
      assert(branch == 0);  // First layer must be primary branch
      assign_tensor(&tensor1[branch], (float **)input,
                    layer_config->in_channels, in_width, in_height, in_stride);
    } else {  // Non-first layer
      // Swap tensor1 and tensor2
      swap_tensor(&tensor1[branch], &tensor2[branch]);

      i_width = tensor1[branch].width;
      i_height = tensor1[branch].height;
    }

    // Allocate output tensor
    av1_find_cnn_layer_output_size(i_width, i_height, layer_config, &o_width,
                                   &o_height);
    const int output_num = layer_config->output_num;
    if (output_num == -1) {  // Non-output layer
      if (!realloc_tensor(&tensor2[branch], layer_config->out_channels, o_width,
                          o_height)) {
        goto Error;
      }
    } else {  // Output layer
      free_tensor(&tensor2[branch]);
      assign_tensor(&tensor2[branch], output[output_num],
                    layer_config->out_channels, o_width, o_height,
                    out_stride[output_num]);
    }

    // If we are combining branches make sure that the branch to combine
    // is different from the current branch.
    assert(IMPLIES(layer_config->branch_combine_type != BRANCH_NOC,
                   !(branch_config->branches_to_combine & (1 << branch))));

    if (layer_config->branch_copy_type == BRANCH_INPUT) {
      if (!copy_active_tensor_to_branches(&tensor1[branch], layer_config,
                                          branch, tensor2)) {
        goto Error;
      }
    }
    // Check consistency of input and output channels
    assert(tensor1[branch].channels == layer_config->in_channels);
    assert(tensor2[branch].channels == layer_config->out_channels);

    // Convolve/Deconvolve
    if (!cnn_config->layer_config[layer].deconvolve) {
      if (thread_data->num_workers > 1) {
        convolve_layer_mt((const float **)tensor1[branch].buf,
                          tensor1[branch].width, tensor1[branch].height,
                          tensor1[branch].stride, layer_config, thread_data,
                          tensor2[branch].buf, tensor2[branch].stride);
      } else {
        av1_cnn_convolve((const float **)tensor1[branch].buf,
                         tensor1[branch].width, tensor1[branch].height,
                         tensor1[branch].stride, layer_config,
                         tensor2[branch].buf, tensor2[branch].stride, 0, 1);
      }
    } else {
      av1_cnn_deconvolve((const float **)tensor1[branch].buf,
                         tensor1[branch].width, tensor1[branch].height,
                         tensor1[branch].stride, layer_config,
                         tensor2[branch].buf, tensor2[branch].stride);
    }

    if (layer_config->branch_copy_type == BRANCH_OUTPUT) {
      if (!copy_active_tensor_to_branches(&tensor2[branch], layer_config,
                                          branch, tensor2)) {
        goto Error;
      }
    }

    // Add tensors from other branches if needed
    if (layer_config->branch_combine_type == BRANCH_ADD) {
      for (int b = 0; b < CNN_MAX_BRANCHES; ++b) {
        if ((branch_config->branches_to_combine & (1 << b)) && b != branch) {
          assert(check_tensor_equal_size(&tensor2[b], &tensor2[branch]));
          av1_cnn_add(tensor2[branch].buf, tensor2[branch].channels,
                      tensor2[branch].width, tensor2[branch].height,
                      tensor2[branch].stride, (const float **)tensor2[b].buf);
        }
      }
    }

    // Non-linearity
    av1_cnn_activate(tensor2[branch].buf, tensor2[branch].channels,
                     tensor2[branch].width, tensor2[branch].height,
                     tensor2[branch].stride, layer_config->activation);

    if (layer_config->bn_params.bn_gamma) {
      av1_cnn_batchnorm(
          tensor2[branch].buf, tensor2[branch].channels, tensor2[branch].width,
          tensor2[branch].height, tensor2[branch].stride,
          layer_config->bn_params.bn_gamma, layer_config->bn_params.bn_beta,
          layer_config->bn_params.bn_mean, layer_config->bn_params.bn_std);
    }

    // Concatenate tensors
    if (layer_config->branch_combine_type == BRANCH_CAT) {
      if (output_num == -1) {  // Non-output layer
        for (int b = 0; b < CNN_MAX_BRANCHES; ++b) {
          if ((branch_config->branches_to_combine & (1 << b)) && b != branch) {
            assert(check_tensor_equal_dims(&tensor2[b], &tensor2[branch]));
            assert(tensor2[b].channels > 0);
            if (!concat_tensor(&tensor2[b], &tensor2[branch])) goto Error;
          }
        }
      } else {  // Output layer
        const int existing_channels = tensor2[branch].channels;
        int num_chs = existing_channels;
        for (int b = 0; b < CNN_MAX_BRANCHES; ++b) {
          if ((branch_config->branches_to_combine & (1 << b)) && b != branch) {
            assert(check_tensor_equal_dims(&tensor2[b], &tensor2[branch]));
            // Needed only to assign the new channel buffers
            num_chs += tensor2[b].channels;
          }
        }
        assign_tensor(&tensor2[branch], output[output_num], num_chs, o_width,
                      o_height, out_stride[output_num]);

        num_chs = existing_channels;
        for (int b = 0; b < CNN_MAX_BRANCHES; ++b) {
          if ((branch_config->branches_to_combine & (1 << b)) && b != branch) {
            assert(check_tensor_equal_dims(&tensor2[b], &tensor2[branch]));
            // Needed only to assign the new channel buffers
            copy_tensor(&tensor2[b], tensor2[b].channels, num_chs,
                        &tensor2[branch]);
            num_chs += tensor2[b].channels;
          }
        }
      }
    }

    if (layer_config->branch_copy_type == BRANCH_COMBINED) {
      if (!copy_active_tensor_to_branches(&tensor2[branch], layer_config,
                                          branch, tensor2)) {
        goto Error;
      }
    }
  }

  success = true;
Error:
  for (int b = 0; b < CNN_MAX_BRANCHES; ++b) {
    free_tensor(&tensor1[b]);
    free_tensor(&tensor2[b]);
  }
  return success;
}